

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_unpack_hdu(undefined8 infptr,undefined8 outfptr,int *param_3)

{
  int iVar1;
  undefined8 in_RAX;
  int lval;
  int hdutype;
  
  if (*param_3 < 1) {
    _lval = in_RAX;
    ffghdt(infptr,&hdutype);
    if (hdutype == 2) {
      ffgky(infptr,0xe,"ZTABLE",&lval,0,param_3);
      if ((*param_3 == 0) && (lval != 0)) {
        fits_uncompress_table(infptr,outfptr,param_3);
        return 0;
      }
      if (*param_3 == 0xca) {
        *param_3 = 0;
      }
    }
    else {
      iVar1 = fits_is_compressed_image(infptr,param_3);
      if (iVar1 != 0) {
        fits_img_decompress(infptr,outfptr,param_3);
        return 0;
      }
    }
    ffcopy(infptr,outfptr,0,param_3);
  }
  return 0;
}

Assistant:

int fp_unpack_hdu (fitsfile *infptr, fitsfile *outfptr, fpstate fpvar, int *status)
{
	int hdutype, lval;

        if (*status > 0) return(0);

	fits_get_hdu_type (infptr, &hdutype, status);

        /* =============================================================== */
        /* This block is only for beta testing of binary table compression */
	if (hdutype == BINARY_TBL) { 

	    fits_read_key(infptr, TLOGICAL, "ZTABLE", &lval, NULL, status);
	    
	    if (*status == 0 && lval != 0) {
	        /*  uncompress the table */
	        fits_uncompress_table (infptr, outfptr, status);
	    } else {
	        if (*status == KEY_NO_EXIST)  /* table is not compressed */
		    *status = 0;
                fits_copy_hdu (infptr, outfptr, 0, status);
            }

	    return(0);
        /* =============================================================== */

	} else if (fits_is_compressed_image (infptr,  status)) {
            /* uncompress the compressed image HDU */
            fits_img_decompress (infptr, outfptr, status);
        } else {
            /* not a compressed image HDU, so just copy it to the output */
            fits_copy_hdu (infptr, outfptr, 0, status);
        }

	return(0);
}